

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSkinMeshBuffer.h
# Opt level: O1

vector3df * __thiscall irr::scene::SSkinMeshBuffer::getNormal(SSkinMeshBuffer *this,u32 i)

{
  ulong uVar1;
  long lVar2;
  pointer pSVar3;
  
  uVar1 = (ulong)i;
  if (this->VertexType == EVT_TANGENTS) {
    pSVar3 = *(pointer *)&(this->super_IMeshBuffer).field_0x8;
    lVar2 = uVar1 * 0x3c;
  }
  else {
    if (this->VertexType != EVT_2TCOORDS) {
      return &(this->Vertices_Standard).m_data.
              super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar1].Normal;
    }
    pSVar3 = (this->Vertices_2TCoords).m_data.
             super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = uVar1 * 0x2c;
  }
  return (vector3df *)((long)&(pSVar3->super_S3DVertex).Normal + lVar2);
}

Assistant:

core::vector3df &getNormal(u32 i) override
	{
		switch (VertexType) {
		case video::EVT_2TCOORDS:
			return Vertices_2TCoords[i].Normal;
		case video::EVT_TANGENTS:
			return Vertices_Tangents[i].Normal;
		default:
			return Vertices_Standard[i].Normal;
		}
	}